

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::TreeEnsembleParameters_TreeNode_EvaluationInfo::MergeFrom
          (TreeEnsembleParameters_TreeNode_EvaluationInfo *this,
          TreeEnsembleParameters_TreeNode_EvaluationInfo *from)

{
  double dVar1;
  void *pvVar2;
  LogMessage *other;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/TreeEnsemble.pb.cc"
               ,0x13b);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar2 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar2 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar2 & 0xfffffffffffffffe));
  }
  if (from->evaluationindex_ != 0) {
    this->evaluationindex_ = from->evaluationindex_;
  }
  dVar1 = from->evaluationvalue_;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    this->evaluationvalue_ = dVar1;
  }
  return;
}

Assistant:

void TreeEnsembleParameters_TreeNode_EvaluationInfo::MergeFrom(const TreeEnsembleParameters_TreeNode_EvaluationInfo& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.TreeEnsembleParameters.TreeNode.EvaluationInfo)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.evaluationindex() != 0) {
    set_evaluationindex(from.evaluationindex());
  }
  if (from.evaluationvalue() != 0) {
    set_evaluationvalue(from.evaluationvalue());
  }
}